

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# noises.cxx
# Opt level: O0

void __thiscall NoiseSource::NoiseSource(NoiseSource *this,Time *time,int n)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  ulong uVar5;
  Noise **ppNVar6;
  double **ppdVar7;
  double *pdVar8;
  double dVar9;
  int local_8c;
  int local_88;
  int i_2;
  int j;
  int i_1;
  int i;
  allocator<char> local_41;
  string local_40;
  int local_1c;
  Time *pTStack_18;
  int n_local;
  Time *time_local;
  NoiseSource *this_local;
  
  local_1c = n;
  pTStack_18 = time;
  time_local = (Time *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_40,"",&local_41);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&i,"Stochastic",(allocator<char> *)((long)&i_1 + 3));
  StochasticProcess::StochasticProcess(&this->super_StochasticProcess,time,&local_40,(string *)&i);
  std::__cxx11::string::~string((string *)&i);
  std::allocator<char>::~allocator((allocator<char> *)((long)&i_1 + 3));
  std::__cxx11::string::~string((string *)&local_40);
  std::allocator<char>::~allocator(&local_41);
  RandN::RandN((RandN *)this);
  (this->super_StochasticProcess).super_Parametric._vptr_Parametric =
       (_func_int **)&PTR__NoiseSource_00190298;
  (this->super_StochasticProcess).super_TimeDependent._vptr_TimeDependent =
       (_func_int **)&PTR__NoiseSource_00190320;
  (this->super_StochasticProcess).super_Physical._vptr_Physical =
       (_func_int **)&PTR__NoiseSource_00190368;
  this->nNoises = local_1c;
  auVar1._8_8_ = 0;
  auVar1._0_8_ = (long)this->nNoises;
  uVar5 = SUB168(auVar1 * ZEXT816(8),0);
  if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  ppNVar6 = (Noise **)operator_new__(uVar5);
  this->aNoises = ppNVar6;
  for (j = 0; j < local_1c; j = j + 1) {
    this->aNoises[j] = (Noise *)0x0;
  }
  auVar2._8_8_ = 0;
  auVar2._0_8_ = (long)this->nNoises;
  uVar5 = SUB168(auVar2 * ZEXT816(8),0);
  if (SUB168(auVar2 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  ppdVar7 = (double **)operator_new__(uVar5);
  this->aA = ppdVar7;
  for (i_2 = 0; i_2 < local_1c; i_2 = i_2 + 1) {
    auVar3._8_8_ = 0;
    auVar3._0_8_ = (long)this->nNoises;
    uVar5 = SUB168(auVar3 * ZEXT816(8),0);
    if (SUB168(auVar3 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    pdVar8 = (double *)operator_new__(uVar5);
    this->aA[i_2] = pdVar8;
    for (local_88 = 0; local_88 < this->nNoises; local_88 = local_88 + 1) {
      if (i_2 == local_88) {
        dVar9 = sqrt((double)this->nNoises);
        this->aA[i_2][local_88] = 1.0 / dVar9;
      }
      else {
        this->aA[i_2][local_88] = 0.0;
      }
    }
  }
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)this->nNoises;
  uVar5 = SUB168(auVar4 * ZEXT816(8),0);
  if (SUB168(auVar4 * ZEXT816(8),8) != 0) {
    uVar5 = 0xffffffffffffffff;
  }
  pdVar8 = (double *)operator_new__(uVar5);
  this->aOmega = pdVar8;
  for (local_8c = 0; local_8c < local_1c; local_8c = local_8c + 1) {
    dVar9 = RandN::dRandN((RandN *)this);
    this->aOmega[local_8c] = dVar9;
  }
  return;
}

Assistant:

NoiseSource::NoiseSource( Time *time,  int n )
	: StochasticProcess(time)
{
	nNoises = n;
	
	// noise array
	aNoises = new Noise *[nNoises];
	for(int i=0; i<n; i++)
		aNoises[i] = 0;
	
	// mixing array
	aA = new double *[nNoises];
	for(int i=0; i<n; i++) {
		aA[i] = new double[nNoises];
		for(int j=0; j<nNoises; j++)
			if (i==j)
				aA[i][j] = 1.0 / sqrt( double(nNoises) );
			else
				aA[i][j] = 0.0;
	}
	
	// omega array
	aOmega = new double[nNoises];
	for(int i=0; i<n; i++)
		aOmega[i] = dRandN();	
}